

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

void __thiscall cmTarget::GetTllSignatureTraces(cmTarget *this,ostream *s,TLLSignature sig)

{
  _Head_base<0UL,_cmTargetInternals_*,_false> _Var1;
  pointer ppVar2;
  cmState *this_00;
  string *top;
  ostream *poVar3;
  char *pcVar4;
  pointer ppVar5;
  cmListFileContext lfc;
  string local_c0;
  undefined1 local_a0 [32];
  string local_80;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_58;
  bool local_38;
  
  pcVar4 = "plain";
  if (sig == KeywordTLLSignature) {
    pcVar4 = "keyword";
  }
  std::__ostream_insert<char,std::char_traits<char>>(s,"The uses of the ",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            (s,pcVar4,(ulong)(sig == KeywordTLLSignature) * 2 + 5);
  std::__ostream_insert<char,std::char_traits<char>>(s," signature are here:\n",0x15);
  _Var1._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  ppVar5 = *(pointer *)
            &((_Var1._M_head_impl)->TLLCommands).
             super__Vector_base<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
  ;
  ppVar2 = *(pointer *)((long)&(_Var1._M_head_impl)->TLLCommands + 8);
  if (ppVar5 != ppVar2) {
    do {
      if (ppVar5->first == sig) {
        cmListFileContext::cmListFileContext((cmListFileContext *)local_a0,&ppVar5->second);
        this_00 = cmMakefile::GetState
                            (((this->impl)._M_t.
                              super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                              .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                             Makefile);
        top = cmState::GetSourceDirectory_abi_cxx11_(this_00);
        cmSystemTools::RelativeIfUnder(&local_c0,top,(string *)(local_a0 + 0x20));
        std::__cxx11::string::operator=((string *)(local_a0 + 0x20),(string *)&local_c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_c0._M_dataplus._M_p._1_7_,local_c0._M_dataplus._M_p._0_1_) !=
            &local_c0.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_c0._M_dataplus._M_p._1_7_,local_c0._M_dataplus._M_p._0_1_),
                          local_c0.field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>(s," * ",3);
        poVar3 = operator<<(s,(cmListFileContext *)local_a0);
        local_c0._M_dataplus._M_p._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_c0,1);
        if (local_38 == true) {
          local_38 = false;
          if (local_58._M_value._M_dataplus._M_p != (_Alloc_hider)(local_a0 + 0x58)) {
            operator_delete((void *)local_58._M_value._M_dataplus._M_p,local_58._16_8_ + 1);
          }
        }
        if (local_80._M_dataplus._M_p != local_a0 + 0x30) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
          operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
        }
      }
      ppVar5 = ppVar5 + 1;
    } while (ppVar5 != ppVar2);
  }
  return;
}

Assistant:

void cmTarget::GetTllSignatureTraces(std::ostream& s, TLLSignature sig) const
{
  const char* sigString =
    (sig == cmTarget::KeywordTLLSignature ? "keyword" : "plain");
  s << "The uses of the " << sigString << " signature are here:\n";
  for (auto const& cmd : this->impl->TLLCommands) {
    if (cmd.first == sig) {
      cmListFileContext lfc = cmd.second;
      lfc.FilePath = cmSystemTools::RelativeIfUnder(
        this->impl->Makefile->GetState()->GetSourceDirectory(), lfc.FilePath);
      s << " * " << lfc << '\n';
    }
  }
}